

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O1

Vec_Ptr_t * Abc_NodeGetSuper(Abc_Obj_t *pNode)

{
  long *plVar1;
  int iVar2;
  uint *__ptr;
  void *pvVar3;
  uint *__ptr_00;
  undefined8 *__ptr_01;
  undefined8 *puVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  uint uVar7;
  size_t sVar8;
  uint uVar9;
  size_t __nmemb;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  
  if ((((ulong)pNode & 1) != 0) || ((*(uint *)&pNode->field_0x14 & 0xf) != 7)) {
    __assert_fail("Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcStrash.c"
                  ,0x26a,"Vec_Ptr_t *Abc_NodeGetSuper(Abc_Obj_t *)");
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 100;
  __ptr[1] = 0;
  pvVar3 = malloc(800);
  *(void **)(__ptr + 2) = pvVar3;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[0] = 100;
  __ptr_00[1] = 0;
  __ptr_01 = (undefined8 *)malloc(800);
  *(undefined8 **)(__ptr_00 + 2) = __ptr_01;
  __ptr_00[1] = 1;
  *__ptr_01 = pNode;
  uVar9 = 1;
  lVar10 = 0;
  do {
    plVar1 = (long *)__ptr_01[lVar10];
    uVar13 = (ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
             *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)plVar1[4] * 8);
    if (((uVar13 & 1) == 0 && (*(uint *)(uVar13 + 0x14) & 0xf) == 7) &&
       (*(int *)(uVar13 + 0x2c) == 1)) {
      uVar7 = *__ptr_00;
      puVar4 = __ptr_01;
      if (uVar9 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (__ptr_01 == (undefined8 *)0x0) {
            puVar4 = (undefined8 *)malloc(0x80);
          }
          else {
            puVar4 = (undefined8 *)realloc(__ptr_01,0x80);
          }
          uVar12 = 0x10;
        }
        else {
          uVar12 = uVar7 * 2;
          if ((int)uVar12 <= (int)uVar7) goto LAB_003080eb;
          if (__ptr_01 == (undefined8 *)0x0) {
            puVar4 = (undefined8 *)malloc((ulong)uVar7 << 4);
          }
          else {
            puVar4 = (undefined8 *)realloc(__ptr_01,(ulong)uVar7 << 4);
          }
        }
        *__ptr_00 = uVar12;
      }
LAB_003080eb:
      __ptr_01 = puVar4;
      uVar12 = uVar9;
      uVar9 = uVar9 + 1;
    }
    else {
      uVar7 = *__ptr;
      uVar12 = __ptr[1];
      if (uVar12 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar3 = malloc(0x80);
          }
          else {
            pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar14 = 0x10;
        }
        else {
          uVar14 = uVar7 * 2;
          if ((int)uVar14 <= (int)uVar7) goto LAB_00308088;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar3 = malloc((ulong)uVar7 << 4);
          }
          else {
            pvVar3 = realloc(*(void **)(__ptr + 2),(ulong)uVar7 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar3;
        *__ptr = uVar14;
      }
LAB_00308088:
      puVar4 = *(undefined8 **)(__ptr + 2);
      __ptr[1] = uVar12 + 1;
    }
    puVar4[(int)uVar12] = uVar13;
    uVar13 = (ulong)(*(uint *)((long)plVar1 + 0x14) >> 0xb & 1) ^
             *(ulong *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) + (long)*(int *)(plVar1[4] + 4) * 8
                       );
    if (((uVar13 & 1) == 0 && (*(uint *)(uVar13 + 0x14) & 0xf) == 7) &&
       (*(int *)(uVar13 + 0x2c) == 1)) {
      uVar7 = *__ptr_00;
      puVar4 = __ptr_01;
      if (uVar9 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (__ptr_01 == (undefined8 *)0x0) {
            puVar4 = (undefined8 *)malloc(0x80);
          }
          else {
            puVar4 = (undefined8 *)realloc(__ptr_01,0x80);
          }
          uVar12 = 0x10;
        }
        else {
          uVar12 = uVar7 * 2;
          if ((int)uVar12 <= (int)uVar7) goto LAB_0030824d;
          if (__ptr_01 == (undefined8 *)0x0) {
            puVar4 = (undefined8 *)malloc((ulong)uVar7 << 4);
          }
          else {
            puVar4 = (undefined8 *)realloc(__ptr_01,(ulong)uVar7 << 4);
          }
        }
        *__ptr_00 = uVar12;
      }
LAB_0030824d:
      __ptr_01 = puVar4;
      uVar12 = uVar9;
      uVar9 = uVar9 + 1;
    }
    else {
      uVar7 = *__ptr;
      uVar12 = __ptr[1];
      if (uVar12 == uVar7) {
        if ((int)uVar7 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar3 = malloc(0x80);
          }
          else {
            pvVar3 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar14 = 0x10;
        }
        else {
          uVar14 = uVar7 * 2;
          if ((int)uVar14 <= (int)uVar7) goto LAB_003081ea;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar3 = malloc((ulong)uVar7 << 4);
          }
          else {
            pvVar3 = realloc(*(void **)(__ptr + 2),(ulong)uVar7 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar3;
        *__ptr = uVar14;
      }
LAB_003081ea:
      puVar4 = *(undefined8 **)(__ptr + 2);
      __ptr[1] = uVar12 + 1;
    }
    puVar4[(int)uVar12] = uVar13;
    lVar10 = lVar10 + 1;
    if ((int)uVar9 <= lVar10) {
      *(undefined8 **)(__ptr_00 + 2) = __ptr_01;
      __ptr_00[1] = uVar9;
      if (__ptr_01 != (undefined8 *)0x0) {
        free(__ptr_01);
        __ptr_00[2] = 0;
        __ptr_00[3] = 0;
      }
      free(__ptr_00);
      uVar9 = __ptr[1];
      pVVar5 = (Vec_Ptr_t *)malloc(0x10);
      uVar7 = 8;
      if (6 < uVar9 - 1) {
        uVar7 = uVar9;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = uVar7;
      if (uVar7 == 0) {
        ppvVar6 = (void **)0x0;
      }
      else {
        ppvVar6 = (void **)malloc((long)(int)uVar7 << 3);
      }
      pVVar5->pArray = ppvVar6;
      if (0 < (int)uVar9) {
        lVar10 = *(long *)(__ptr + 2);
        lVar11 = (long)pVVar5->nSize;
        uVar7 = pVVar5->nCap;
        ppvVar6 = pVVar5->pArray;
        lVar15 = (ulong)uVar9 + 1;
        do {
          pvVar3 = *(void **)(lVar10 + -0x10 + lVar15 * 8);
          if ((uint)lVar11 == uVar7) {
            if ((int)uVar7 < 0x10) {
              if (ppvVar6 == (void **)0x0) {
                ppvVar6 = (void **)malloc(0x80);
              }
              else {
                ppvVar6 = (void **)realloc(ppvVar6,0x80);
              }
              uVar7 = 0x10;
            }
            else {
              uVar9 = uVar7 * 2;
              if (SBORROW4(uVar7,uVar9) != 0 < (int)uVar7) {
                uVar7 = uVar9;
                if (ppvVar6 == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar9 << 3);
                }
                else {
                  ppvVar6 = (void **)realloc(ppvVar6,(ulong)uVar9 << 3);
                }
              }
            }
          }
          ppvVar6[lVar11] = pvVar3;
          lVar11 = lVar11 + 1;
          lVar15 = lVar15 + -1;
        } while (1 < lVar15);
        pVVar5->nSize = (int)lVar11;
        pVVar5->nCap = uVar7;
        pVVar5->pArray = ppvVar6;
      }
      if (*(void **)(__ptr + 2) != (void *)0x0) {
        free(*(void **)(__ptr + 2));
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
      __nmemb = (size_t)pVVar5->nSize;
      if (1 < (long)__nmemb) {
        ppvVar6 = pVVar5->pArray;
        qsort(ppvVar6,__nmemb,8,Vec_CompareNodeIds);
        iVar2 = 1;
        sVar8 = 1;
        do {
          if (ppvVar6[sVar8] != ppvVar6[sVar8 - 1]) {
            lVar10 = (long)iVar2;
            iVar2 = iVar2 + 1;
            ppvVar6[lVar10] = ppvVar6[sVar8];
          }
          sVar8 = sVar8 + 1;
        } while (__nmemb != sVar8);
        pVVar5->nSize = iVar2;
      }
      return pVVar5;
    }
  } while( true );
}

Assistant:

Vec_Ptr_t * Abc_NodeGetSuper( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vSuper, * vFront;
    Abc_Obj_t * pAnd, * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNode) && !Abc_ObjIsComplement(pNode) );
    vSuper = Vec_PtrAlloc( 100 ); 
    // explore the frontier
    vFront = Vec_PtrAlloc( 100 );
    Vec_PtrPush( vFront, pNode );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pAnd, i )
    {
        pFanin = Abc_ObjChild0(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );

        pFanin = Abc_ObjChild1(pAnd);
        if ( Abc_ObjIsNode(pFanin) && !Abc_ObjIsComplement(pFanin) && Abc_ObjFanoutNum(pFanin) == 1 )
            Vec_PtrPush( vFront, pFanin );
        else
            Vec_PtrPush( vSuper, pFanin );
    }
    Vec_PtrFree( vFront );
    // reverse the array of pointers to start with lower IDs
    vFront = Vec_PtrAlloc( Vec_PtrSize(vSuper) );
    Vec_PtrForEachEntryReverse( Abc_Obj_t *, vSuper, pNode, i )
        Vec_PtrPush( vFront, pNode );
    Vec_PtrFree( vSuper );
    vSuper = vFront;
    // uniquify and return the frontier
    Vec_PtrUniqify( vSuper, (int (*)())Vec_CompareNodeIds );
    return vSuper;
}